

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiin.cpp
# Opt level: O0

int anon_unknown.dwarf_fc70::RtMidiIn_dtor(lua_State *L)

{
  RtMidiIn *pRVar1;
  bool bVar2;
  pointer ppVar3;
  _Self local_38;
  pair<RtMidiIn_*,_lua_State_*> local_30;
  _Self local_20;
  iterator it;
  RtMidiIn *midiin;
  lua_State *L_local;
  
  midiin = (RtMidiIn *)L;
  it._M_node = (_Base_ptr)lua_touserdata(L,1);
  if (it._M_node != (_Base_ptr)0x0) {
    std::pair<RtMidiIn_*,_lua_State_*>::pair<RtMidiIn_*&,_lua_State_*&,_true>
              (&local_30,(RtMidiIn **)&it,(lua_State **)&midiin);
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::pair<RtMidiIn_*,_lua_State_*>,_int,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
         ::find((map<std::pair<RtMidiIn_*,_lua_State_*>,_int,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
                 *)(anonymous_namespace)::RtMidiIn_callbacks,&local_30);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::pair<RtMidiIn_*,_lua_State_*>,_int,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
         ::end((map<std::pair<RtMidiIn_*,_lua_State_*>,_int,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
                *)(anonymous_namespace)::RtMidiIn_callbacks);
    bVar2 = std::operator!=(&local_20,&local_38);
    pRVar1 = midiin;
    if (bVar2) {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>::
               operator->(&local_20);
      luaL_unref(pRVar1,0xfff0b9d8,ppVar3->second);
      std::
      map<std::pair<RtMidiIn*,lua_State*>,int,std::less<std::pair<RtMidiIn*,lua_State*>>,std::allocator<std::pair<std::pair<RtMidiIn*,lua_State*>const,int>>>
      ::erase_abi_cxx11_((map<std::pair<RtMidiIn*,lua_State*>,int,std::less<std::pair<RtMidiIn*,lua_State*>>,std::allocator<std::pair<std::pair<RtMidiIn*,lua_State*>const,int>>>
                          *)(anonymous_namespace)::RtMidiIn_callbacks,(iterator)local_20._M_node);
    }
    (**(code **)(*(long *)it._M_node + 0x38))();
  }
  return 0;
}

Assistant:

int RtMidiIn_dtor(lua_State *L) {
	auto midiin = reinterpret_cast<RtMidiIn *>(lua_touserdata(L, 1));
	if (midiin) {
		auto it = RtMidiIn_callbacks.find({midiin, L});
		if (it != RtMidiIn_callbacks.end()) {
			luaL_unref(L, LUA_REGISTRYINDEX, it->second);
			RtMidiIn_callbacks.erase(it);
		}
		midiin->~RtMidiIn();
	}
	return 0;
}